

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ImmediatePromiseNode<kj::_::Void>::get
          (ImmediatePromiseNode<kj::_::Void> *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> *pEVar1;
  ExceptionOr<kj::_::Void> *this_00;
  ExceptionOrValue *output_local;
  ImmediatePromiseNode<kj::_::Void> *this_local;
  
  pEVar1 = mv<kj::_::ExceptionOr<kj::_::Void>>(&this->result);
  this_00 = ExceptionOrValue::as<kj::_::Void>(output);
  ExceptionOr<kj::_::Void>::operator=(this_00,pEVar1);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    output.as<T>() = kj::mv(result);
  }